

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfilesystemmodel.cpp
# Opt level: O2

bool __thiscall
QFileSystemModelPrivate::passNameFilters(QFileSystemModelPrivate *this,QFileSystemNode *node)

{
  QRegularExpression *pQVar1;
  bool bVar2;
  bool bVar3;
  __normal_iterator<const_QRegularExpression_*,_std::vector<QRegularExpression,_std::allocator<QRegularExpression>_>_>
  __it;
  long lVar4;
  long lVar5;
  __normal_iterator<const_QRegularExpression_*,_std::vector<QRegularExpression,_std::allocator<QRegularExpression>_>_>
  _Var6;
  long in_FS_OFFSET;
  QFileSystemNode *local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  bVar3 = true;
  if (((this->nameFilters).d.size == 0) ||
     ((bVar2 = QFileSystemNode::isDir(node), bVar2 &&
      (((this->filters).super_QFlagsStorageHelper<QDir::Filter,_4>.super_QFlagsStorage<QDir::Filter>
        .i & 0x400) != 0)))) goto LAB_0056fab2;
  __it._M_current =
       (this->nameFiltersRegexps).
       super__Vector_base<QRegularExpression,_std::allocator<QRegularExpression>_>._M_impl.
       super__Vector_impl_data._M_start;
  pQVar1 = (this->nameFiltersRegexps).
           super__Vector_base<QRegularExpression,_std::allocator<QRegularExpression>_>._M_impl.
           super__Vector_impl_data._M_finish;
  lVar5 = (long)pQVar1 - (long)__it._M_current;
  local_40 = node;
  for (lVar4 = lVar5 >> 5; 0 < lVar4; lVar4 = lVar4 + -1) {
    bVar3 = __gnu_cxx::__ops::
            _Iter_pred<QFileSystemModelPrivate::passNameFilters(QFileSystemModelPrivate::QFileSystemNode_const*)const::$_0>
            ::operator()((_Iter_pred<QFileSystemModelPrivate::passNameFilters(QFileSystemModelPrivate::QFileSystemNode_const*)const::__0>
                          *)&local_40,__it);
    _Var6._M_current = __it._M_current;
    if (bVar3) goto LAB_0056faac;
    bVar3 = __gnu_cxx::__ops::
            _Iter_pred<QFileSystemModelPrivate::passNameFilters(QFileSystemModelPrivate::QFileSystemNode_const*)const::$_0>
            ::operator()((_Iter_pred<QFileSystemModelPrivate::passNameFilters(QFileSystemModelPrivate::QFileSystemNode_const*)const::__0>
                          *)&local_40,__it._M_current + 1);
    _Var6._M_current = __it._M_current + 1;
    if (bVar3) goto LAB_0056faac;
    bVar3 = __gnu_cxx::__ops::
            _Iter_pred<QFileSystemModelPrivate::passNameFilters(QFileSystemModelPrivate::QFileSystemNode_const*)const::$_0>
            ::operator()((_Iter_pred<QFileSystemModelPrivate::passNameFilters(QFileSystemModelPrivate::QFileSystemNode_const*)const::__0>
                          *)&local_40,__it._M_current + 2);
    _Var6._M_current = __it._M_current + 2;
    if (bVar3) goto LAB_0056faac;
    bVar3 = __gnu_cxx::__ops::
            _Iter_pred<QFileSystemModelPrivate::passNameFilters(QFileSystemModelPrivate::QFileSystemNode_const*)const::$_0>
            ::operator()((_Iter_pred<QFileSystemModelPrivate::passNameFilters(QFileSystemModelPrivate::QFileSystemNode_const*)const::__0>
                          *)&local_40,__it._M_current + 3);
    _Var6._M_current = __it._M_current + 3;
    if (bVar3) goto LAB_0056faac;
    __it._M_current = __it._M_current + 4;
    lVar5 = lVar5 + -0x20;
  }
  lVar5 = lVar5 >> 3;
  if (lVar5 == 1) {
LAB_0056fa96:
    bVar3 = __gnu_cxx::__ops::
            _Iter_pred<QFileSystemModelPrivate::passNameFilters(QFileSystemModelPrivate::QFileSystemNode_const*)const::$_0>
            ::operator()((_Iter_pred<QFileSystemModelPrivate::passNameFilters(QFileSystemModelPrivate::QFileSystemNode_const*)const::__0>
                          *)&local_40,__it);
    _Var6._M_current = __it._M_current;
    if (!bVar3) {
      _Var6._M_current = pQVar1;
    }
  }
  else if (lVar5 == 2) {
LAB_0056fa81:
    bVar3 = __gnu_cxx::__ops::
            _Iter_pred<QFileSystemModelPrivate::passNameFilters(QFileSystemModelPrivate::QFileSystemNode_const*)const::$_0>
            ::operator()((_Iter_pred<QFileSystemModelPrivate::passNameFilters(QFileSystemModelPrivate::QFileSystemNode_const*)const::__0>
                          *)&local_40,__it);
    _Var6._M_current = __it._M_current;
    if (!bVar3) {
      __it._M_current = __it._M_current + 1;
      goto LAB_0056fa96;
    }
  }
  else {
    _Var6._M_current = pQVar1;
    if ((lVar5 == 3) &&
       (bVar3 = __gnu_cxx::__ops::
                _Iter_pred<QFileSystemModelPrivate::passNameFilters(QFileSystemModelPrivate::QFileSystemNode_const*)const::$_0>
                ::operator()((_Iter_pred<QFileSystemModelPrivate::passNameFilters(QFileSystemModelPrivate::QFileSystemNode_const*)const::__0>
                              *)&local_40,__it), _Var6._M_current = __it._M_current, !bVar3)) {
      __it._M_current = __it._M_current + 1;
      goto LAB_0056fa81;
    }
  }
LAB_0056faac:
  bVar3 = _Var6._M_current != pQVar1;
LAB_0056fab2:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return bVar3;
}

Assistant:

bool QFileSystemModelPrivate::passNameFilters(const QFileSystemNode *node) const
{
#if QT_CONFIG(regularexpression)
    if (nameFilters.isEmpty())
        return true;

    // Check the name regularexpression filters
    if (!(node->isDir() && (filters & QDir::AllDirs))) {
        const auto matchesNodeFileName = [node](const QRegularExpression &re)
        {
            return node->fileName.contains(re);
        };
        return std::any_of(nameFiltersRegexps.begin(),
                           nameFiltersRegexps.end(),
                           matchesNodeFileName);
    }
#else
    Q_UNUSED(node);
#endif
    return true;
}